

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,int stage,realtype cdiff)

{
  uint uVar1;
  int iVar2;
  realtype *c;
  N_Vector *X;
  MRIStepCoupling pMVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  
  c = step_mem->cvals;
  X = step_mem->Xvecs;
  uVar4 = 0;
  uVar7 = 0;
  if (0 < stage) {
    uVar7 = (ulong)(uint)stage;
  }
  iVar6 = 0;
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    if ((step_mem->explicit_rhs != 0) && (-1 < (long)step_mem->stage_map[uVar4])) {
      X[iVar6] = step_mem->Fse[step_mem->stage_map[uVar4]];
      iVar6 = iVar6 + 1;
    }
    if ((step_mem->implicit_rhs != 0) && (-1 < (long)step_mem->stage_map[uVar4])) {
      X[iVar6] = step_mem->Fsi[step_mem->stage_map[uVar4]];
      iVar6 = iVar6 + 1;
    }
  }
  uVar1 = step_mem->MRIC->nmat;
  dVar8 = 1.0 / cdiff;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar4 == uVar1) {
      return 0;
    }
    iVar6 = 0;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      if (-1 < step_mem->stage_map[uVar5]) {
        if (step_mem->explicit_rhs == 0) {
          c[iVar6] = step_mem->MRIC->G[uVar4][stage][uVar5] * dVar8;
        }
        else {
          iVar2 = step_mem->implicit_rhs;
          pMVar3 = step_mem->MRIC;
          c[iVar6] = pMVar3->W[uVar4][stage][uVar5] * dVar8;
          if (iVar2 != 0) {
            c[(long)iVar6 + 1] = pMVar3->G[uVar4][stage][uVar5] * dVar8;
            iVar6 = iVar6 + 2;
            goto LAB_004b278d;
          }
        }
        iVar6 = iVar6 + 1;
      }
LAB_004b278d:
    }
    iVar6 = N_VLinearCombination(iVar6,c,X,step_mem->stepper->forcing[uVar4]);
    uVar4 = uVar4 + 1;
    if (iVar6 != 0) {
      return -0x1c;
    }
  } while( true );
}

Assistant:

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,
                                int stage, realtype cdiff)
{
  realtype  rcdiff;
  int       j, k, nmat, nstore, retval;
  realtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++) {
    nstore = 0;
    for (j = 0; j < stage; j++) {
      if (step_mem->stage_map[j] > -1) {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs) {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        } else if (step_mem->explicit_rhs) {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        } else {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) return(ARK_VECTOROP_ERR);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  for (k = 0; k < nmat; k++) {
    printf("    MRIStep forcing[%i]:\n", k);
    N_VPrint(step_mem->stepper->forcing[k]);
  }
#endif

  return(ARK_SUCCESS);
}